

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_add_digits(sexp ctx,sexp dst,sexp a,sexp b)

{
  long *plVar1;
  ulong uVar2;
  sexp_uint_t sVar3;
  sexp_uint_t sVar4;
  sexp psVar5;
  sexp_uint_t sVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  sexp local_48;
  sexp_gc_var_t local_40;
  
  sVar3 = sexp_bignum_hi(a);
  sVar4 = sexp_bignum_hi(b);
  local_48 = (sexp)0x43e;
  if (sVar3 < sVar4) {
    psVar5 = sexp_bignum_add_digits(ctx,dst,b,a);
    return psVar5;
  }
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  local_40.var = &local_48;
  if (dst != (sexp)0x0) {
    local_40.var = &local_48;
    sVar6 = sexp_bignum_hi(dst);
    if (sVar3 <= sVar6) goto LAB_00118ea7;
  }
  dst = sexp_copy_bignum(ctx,(sexp)0x0,a,0);
LAB_00118ea7:
  uVar8 = 0;
  for (sVar6 = 0; sVar4 != sVar6; sVar6 = sVar6 + 1) {
    uVar2 = *(ulong *)((long)&a->value + sVar6 * 8 + 0x10);
    uVar7 = *(long *)((long)&b->value + sVar6 * 8 + 0x10) + uVar2;
    *(ulong *)((long)&dst->value + sVar6 * 8 + 0x10) = uVar8 + uVar7;
    uVar8 = (ulong)CARRY8(uVar2,*(ulong *)((long)&b->value + sVar6 * 8 + 0x10)) +
            (ulong)CARRY8(uVar7,uVar8);
  }
  bVar9 = uVar8 != 0;
  for (; (bVar9 && (sVar4 < sVar3)); sVar4 = sVar4 + 1) {
    plVar1 = (long *)((long)&dst->value + sVar4 * 8 + 0x10);
    *plVar1 = *plVar1 + 1;
    bVar9 = *plVar1 == 0;
  }
  if (bVar9) {
    local_48 = dst;
    dst = sexp_copy_bignum(ctx,(sexp)0x0,dst,sVar3 + 1);
    *(undefined8 *)((long)&dst->value + sVar3 * 8 + 0x10) = 1;
  }
  (ctx->value).context.saves = local_40.next;
  return dst;
}

Assistant:

sexp sexp_bignum_add_digits (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp_uint_t alen=sexp_bignum_hi(a), blen=sexp_bignum_hi(b),
    carry=0, i, old_a, p_sum, *adata, *bdata, *cdata;
  sexp_gc_var1(c);
  if (alen < blen) return sexp_bignum_add_digits(ctx, dst, b, a);
  sexp_gc_preserve1(ctx, c);
  c = ((dst && sexp_bignum_hi(dst) >= alen)
       ? dst : sexp_copy_bignum(ctx, NULL, a, 0));
  adata = sexp_bignum_data(a);
  bdata = sexp_bignum_data(b);
  cdata = sexp_bignum_data(c);
  for (i=0; i<blen; i++) {
    old_a = adata[i]; /* adata may alias cdata */
    p_sum = adata[i] + bdata[i];
    cdata[i] = p_sum + carry;
    carry = (old_a > (SEXP_UINT_T_MAX - bdata[i]) ? 1 : 0)
          + (p_sum > (SEXP_UINT_T_MAX - carry) ? 1 : 0);
  }
  for ( ; carry && (i<alen); i++) {
    carry = (cdata[i] == SEXP_UINT_T_MAX ? 1 : 0);
    cdata[i]++;
  }
  if (carry) {
    c = sexp_copy_bignum(ctx, NULL, c, alen+1);
    sexp_bignum_data(c)[alen] = 1;
  }
  sexp_gc_release1(ctx);
  return c;
}